

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_buildInfo.cpp
# Opt level: O0

char * amrex::buildInfoGetGitHash(int i)

{
  int i_local;
  char *local_8;
  
  if (i == 1) {
    local_8 = "v1.0.1-37-g21a5a7f25a03";
  }
  else if (i == 2) {
    local_8 = "22.09";
  }
  else {
    local_8 = "";
  }
  return local_8;
}

Assistant:

const char* buildInfoGetGitHash(int i) {

  //static const char HASH1[] = "${GIT[1]}";
  static const char HASH1[] = "v1.0.1-37-g21a5a7f25a03";
  static const char HASH2[] = "22.09";
  static const char EMPT[] = "";

  switch(i)
  {
    case 1: return HASH1;
    case 2: return HASH2;
    default: return EMPT;
  }
}